

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O2

TColor rgbToAnsi256(ImU32 col,bool doAlpha)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar3 = col >> 8;
  uVar1 = col >> 0x10;
  uVar2 = uVar3 & 0xff;
  if (uVar2 == (uVar1 & 0xff) && (col & 0xff) == uVar2) {
    if (doAlpha) {
      col = (ImU32)(((float)(col >> 0x18) * (float)(col & 0xff)) / 255.0);
    }
    if ((byte)col < 8) {
      return '\x10';
    }
    if (0xf8 < (byte)col) {
      return 0xe7;
    }
    fVar4 = roundf(((float)(int)((col & 0xff) - 8) / 247.0) * 24.0);
    fVar4 = fVar4 + 232.0;
  }
  else {
    if (doAlpha) {
      fVar6 = (float)(col >> 0x18) / 255.0;
      fVar5 = roundf((float)(col & 0xff) * fVar6);
      col = (ImU32)fVar5;
      fVar5 = roundf((float)uVar2 * fVar6);
      uVar3 = (uint)fVar5;
      fVar5 = roundf((float)(uVar1 & 0xff) * fVar6);
      uVar1 = (uint)fVar5;
    }
    fVar5 = roundf(((float)(col & 0xff) / 255.0) * 5.0);
    fVar6 = roundf(((float)(uVar3 & 0xff) / 255.0) * 5.0);
    fVar4 = roundf(((float)(uVar1 & 0xff) / 255.0) * 5.0);
    fVar4 = fVar4 + fVar6 * 6.0 + fVar5 * 36.0 + 16.0;
  }
  return (TColor)(int)fVar4;
}

Assistant:

inline ImTui::TColor rgbToAnsi256(ImU32 col, bool doAlpha) {
    ImTui::TColor r = col & 0x000000FF;
    ImTui::TColor g = (col & 0x0000FF00) >> 8;
    ImTui::TColor b = (col & 0x00FF0000) >> 16;

    if (r == g && g == b) {
        if (doAlpha) {
            ImTui::TColor a = (col & 0xFF000000) >> 24;
            r = (float(r)*a)/255.0f;
        }
        if (r < 8) {
            return 16;
        }

        if (r > 248) {
            return 231;
        }

        return std::round((float(r - 8) / 247) * 24) + 232;
    }

    if (doAlpha) {
        ImTui::TColor a = (col & 0xFF000000) >> 24;
        float scale = float(a)/255.0f;
        r = std::round(r*scale);
        g = std::round(g*scale);
        b = std::round(b*scale);
    }

    ImTui::TColor res = 16
        + (36 * std::round((float(r) / 255.0f) * 5.0f))
        + (6 * std::round((float(g) / 255.0f) * 5.0f))
        + std::round((float(b) / 255.0f) * 5.0f);

    return res;
}